

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall
pbrt::Image::CopyRectOut(Image *this,Bounds2i *extent,span<float> buf,WrapMode2D wrapMode)

{
  span<float> vout;
  span<const_unsigned_char> vin;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  array<pbrt::WrapMode,_2> wrapMode_00;
  size_t index;
  reference ptr;
  int *in_RSI;
  int *in_RDI;
  anon_class_16_2_22da72ca op;
  size_t offset;
  int y;
  size_t count;
  iterator bufIter;
  int vb;
  size_t va;
  Image *in_stack_fffffffffffffec8;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffed0;
  Bounds2<int> *in_stack_fffffffffffffed8;
  Bounds2<int> *in_stack_fffffffffffffee0;
  float *pfVar6;
  int *piVar7;
  char (*in_stack_ffffffffffffff18) [28];
  char (*in_stack_ffffffffffffff20) [11];
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  LogLevel level;
  char (*in_stack_ffffffffffffff50) [11];
  unsigned_long *in_stack_ffffffffffffff58;
  char (*in_stack_ffffffffffffff60) [28];
  int *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  LogLevel in_stack_ffffffffffffff84;
  Image *in_stack_ffffffffffffff98;
  Bounds2i *in_stack_ffffffffffffffa0;
  anon_class_16_2_22da72ca in_stack_ffffffffffffffa8;
  span<float> local_18;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  iVar4 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  sVar5 = pstd::span<float>::size(&local_18);
  iVar2 = Bounds2<int>::Area((Bounds2<int> *)in_stack_fffffffffffffed0);
  iVar3 = NChannels((Image *)0x4c1c2d);
  if (sVar5 < (ulong)(long)(iVar2 * iVar3)) {
    LogFatal<char_const(&)[11],char_const(&)[28],char_const(&)[11],unsigned_long&,char_const(&)[28],int&>
              (level,in_stack_ffffffffffffff38,iVar4,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  }
  wrapMode_00.values = (WrapMode  [2])pstd::span<float>::begin(&local_18);
  iVar3 = *in_RDI;
  if (iVar3 == 0) {
    piVar7 = in_RSI;
    Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffed0,
                        (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                        (int)in_stack_fffffffffffffec8);
    Bounds2<int>::Bounds2
              (in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->pMin,
               (Point2<int> *)in_stack_fffffffffffffed0);
    op = (anon_class_16_2_22da72ca)
         Intersect<int>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    bVar1 = Bounds2<int>::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (bVar1) {
      iVar4 = NChannels((Image *)0x4c1d78);
      sVar5 = (size_t)(iVar4 * (in_RSI[2] - *in_RSI));
      for (iVar4 = in_RSI[1]; iVar4 < in_RSI[3]; iVar4 = iVar4 + 1) {
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffed0,
                            (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                            (int)in_stack_fffffffffffffec8);
        index = PixelOffset(in_stack_fffffffffffffec8,(Point2i)in_stack_fffffffffffffed0);
        pfVar6 = (float *)(in_RDI + 0x2c);
        ptr = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
              operator[]((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                         (in_RDI + 0x2e),index);
        pstd::span<const_unsigned_char>::span
                  ((span<const_unsigned_char> *)&stack0xffffffffffffff60,ptr,sVar5);
        pstd::span<float>::span
                  ((span<float> *)&stack0xffffffffffffff50,(float *)wrapMode_00.values,sVar5);
        vin.ptr._4_4_ = iVar2;
        vin.ptr._0_4_ = iVar3;
        vin.n = (size_t)in_RDI;
        vout.n = (size_t)piVar7;
        vout.ptr = pfVar6;
        ColorEncodingHandle::ToLinear((ColorEncodingHandle *)in_stack_fffffffffffffee0,vin,vout);
        wrapMode_00.values = sVar5 * 4 + wrapMode_00.values;
      }
    }
    else {
      ForExtent<pbrt::Image::CopyRectOut(pbrt::Bounds2<int>const&,pstd::span<float>,pbrt::WrapMode2D)::__0>
                (in_stack_ffffffffffffffa0,(WrapMode2D)wrapMode_00.values,in_stack_ffffffffffffff98,
                 op);
    }
  }
  else if (iVar3 == 1) {
    ForExtent<pbrt::Image::CopyRectOut(pbrt::Bounds2<int>const&,pstd::span<float>,pbrt::WrapMode2D)::__1>
              (in_stack_ffffffffffffffa0,(WrapMode2D)wrapMode_00.values,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffffa8);
  }
  else {
    if (iVar3 != 2) {
      LogFatal(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               (char *)in_stack_ffffffffffffff68);
    }
    ForExtent<pbrt::Image::CopyRectOut(pbrt::Bounds2<int>const&,pstd::span<float>,pbrt::WrapMode2D)::__2>
              (in_stack_ffffffffffffffa0,(WrapMode2D)wrapMode_00.values,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void Image::CopyRectOut(const Bounds2i &extent, pstd::span<float> buf,
                        WrapMode2D wrapMode) {
    CHECK_GE(buf.size(), extent.Area() * NChannels());

    auto bufIter = buf.begin();
    switch (format) {
    case PixelFormat::U256:
        if (Intersect(extent, Bounds2i({0, 0}, resolution)) == extent) {
            // All in bounds
            size_t count = NChannels() * (extent.pMax.x - extent.pMin.x);
            for (int y = extent.pMin.y; y < extent.pMax.y; ++y) {
                // Convert scanlines all at once.
                size_t offset = PixelOffset({extent.pMin.x, y});
#ifdef PBRT_FLOAT_AS_DOUBLE
                for (int i = 0; i < count; ++i) {
                    Float v;
                    encoding.ToLinear({&p8[offset + i], 1}, {&v, 1});
                    *bufIter++ = v;
                }
#else
                encoding.ToLinear({&p8[offset], count}, {&*bufIter, count});
#endif
                bufIter += count;
            }
        } else {
            ForExtent(extent, wrapMode, *this, [&bufIter, this](int offset) {
#ifdef PBRT_FLOAT_AS_DOUBLE
                Float v;
                encoding.ToLinear({&p8[offset], 1}, {&v, 1});
                *bufIter = v;
#else
                encoding.ToLinear({&p8[offset], 1}, {&*bufIter, 1});
#endif
                ++bufIter;
            });
        }
        break;

    case PixelFormat::Half:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p16[offset]); });
        break;

    case PixelFormat::Float:
        ForExtent(extent, wrapMode, *this,
                  [&bufIter, this](int offset) { *bufIter++ = Float(p32[offset]); });
        break;

    default:
        LOG_FATAL("Unhandled PixelFormat");
    }
}